

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::TimedTest::result(TimedTest *this)

{
  element_type *peVar1;
  long in_RSI;
  shared_ptr<const_oout::Result> local_58;
  time_point end;
  unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> local_38;
  undefined1 local_30 [8];
  shared_ptr<const_oout::Result> result;
  time_point begin;
  TimedTest *this_local;
  
  result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::chrono::_V2::system_clock::now();
  peVar1 = std::__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(in_RSI + 8));
  (*peVar1->_vptr_Test[2])();
  std::shared_ptr<oout::Result_const>::
  shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((shared_ptr<oout::Result_const> *)local_30,&local_38);
  std::unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_>::~unique_ptr
            (&local_38);
  local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  std::
  make_unique<oout::TimedResult_const,std::shared_ptr<oout::Result_const>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&local_58,(duration<long,_std::ratio<1L,_1000000000L>_> *)local_30);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::TimedResult_const,std::default_delete<oout::TimedResult_const>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<const_oout::TimedResult,_std::default_delete<const_oout::TimedResult>_> *)
             &local_58);
  std::unique_ptr<const_oout::TimedResult,_std::default_delete<const_oout::TimedResult>_>::
  ~unique_ptr((unique_ptr<const_oout::TimedResult,_std::default_delete<const_oout::TimedResult>_> *)
              &local_58);
  std::shared_ptr<const_oout::Result>::~shared_ptr((shared_ptr<const_oout::Result> *)local_30);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> TimedTest::result() const
{
	const auto begin = chrono::high_resolution_clock::now();
	const shared_ptr<const Result> result = test->result();
	const auto end = chrono::high_resolution_clock::now();
	return make_unique<const TimedResult>(result, end - begin);
}